

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_null.h
# Opt level: O3

double __thiscall labeling_NULL::Alloc(labeling_NULL *this)

{
  int *piVar1;
  Mat1i *pMVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Mat local_70 [96];
  
  lVar6 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar6;
  piVar1 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_70,*piVar1,piVar1[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_70);
  cv::Mat::~Mat(local_70);
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar2->field_0x10,0,*(long *)&pMVar2->field_0x20 - *(long *)&pMVar2->field_0x18
        );
  lVar6 = cv::getTickCount();
  dVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  dVar3 = (double)lVar6 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar3;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar3;
  lVar6 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar6;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar2->field_0x10,0,*(long *)&pMVar2->field_0x20 - *(long *)&pMVar2->field_0x18
        );
  lVar6 = cv::getTickCount();
  dVar4 = (double)lVar6 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar4;
  auVar7._0_8_ = dVar3 * 1000.0;
  auVar7._8_8_ = dVar4 * 1000.0;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar4 + (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
               total;
  dVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  auVar8._8_4_ = SUB84(dVar3,0);
  auVar8._0_8_ = dVar5;
  auVar8._12_4_ = (int)((ulong)dVar3 >> 0x20);
  auVar8 = divpd(auVar7,auVar8);
  return auVar8._0_8_ - auVar8._8_8_;
}

Assistant:

double Alloc()
    {
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ma_t;
    }